

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)

{
  char *__s;
  ulong uVar1;
  ulong __n;
  ulong __n_00;
  char *pcVar2;
  
  __n = (ulong)ctx->indent * (long)ctx->level;
  pcVar2 = ctx->pflush;
  __s = ctx->p;
  if (pcVar2 < __s + __n) {
    if (pcVar2 <= __s) {
      (*ctx->flush)(ctx,0);
      pcVar2 = ctx->pflush;
      __s = ctx->p;
    }
    __n_00 = (long)pcVar2 - (long)__s;
    while (uVar1 = __n - __n_00, __n_00 <= __n && uVar1 != 0) {
      memset(__s,0x20,__n_00);
      ctx->p = ctx->p + __n_00;
      (*ctx->flush)(ctx,0);
      __s = ctx->p;
      __n = uVar1;
      __n_00 = (long)ctx->pflush - (long)__s;
    }
  }
  memset(__s,0x20,__n);
  ctx->p = ctx->p + __n;
  return;
}

Assistant:

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)
{
    /*
     * This is only needed when indent is 0 but helps external users
     * to avoid flushing when indenting.
     */
    print_indent(ctx);
}